

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

aiBone * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpBone
          (Bone *this,Skeleton *param_1,
          vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *boneWeights)

{
  pointer __src;
  pointer paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  aiBone *paVar17;
  aiVertexWeight *__s;
  ulong uVar18;
  
  paVar17 = (aiBone *)operator_new(0x450);
  (paVar17->mName).length = 0;
  (paVar17->mName).data[0] = '\0';
  memset((paVar17->mName).data + 1,0x1b,0x3ff);
  paVar17->mNumWeights = 0;
  paVar17->mWeights = (aiVertexWeight *)0x0;
  (paVar17->mOffsetMatrix).a1 = 1.0;
  (paVar17->mOffsetMatrix).a2 = 0.0;
  (paVar17->mOffsetMatrix).a3 = 0.0;
  (paVar17->mOffsetMatrix).a4 = 0.0;
  (paVar17->mOffsetMatrix).b1 = 0.0;
  (paVar17->mOffsetMatrix).b2 = 1.0;
  (paVar17->mOffsetMatrix).b3 = 0.0;
  (paVar17->mOffsetMatrix).b4 = 0.0;
  (paVar17->mOffsetMatrix).c1 = 0.0;
  (paVar17->mOffsetMatrix).c2 = 0.0;
  (paVar17->mOffsetMatrix).c3 = 1.0;
  (paVar17->mOffsetMatrix).c4 = 0.0;
  (paVar17->mOffsetMatrix).d1 = 0.0;
  (paVar17->mOffsetMatrix).d2 = 0.0;
  (paVar17->mOffsetMatrix).d3 = 0.0;
  (paVar17->mOffsetMatrix).d4 = 1.0;
  uVar18 = (this->name)._M_string_length;
  if (uVar18 < 0x400) {
    (paVar17->mName).length = (ai_uint32)uVar18;
    memcpy((paVar17->mName).data,(this->name)._M_dataplus._M_p,uVar18);
    (paVar17->mName).data[uVar18] = '\0';
  }
  fVar13 = (this->worldMatrix).a1;
  fVar14 = (this->worldMatrix).a2;
  fVar15 = (this->worldMatrix).a3;
  fVar16 = (this->worldMatrix).a4;
  fVar9 = (this->worldMatrix).b1;
  fVar10 = (this->worldMatrix).b2;
  fVar11 = (this->worldMatrix).b3;
  fVar12 = (this->worldMatrix).b4;
  fVar5 = (this->worldMatrix).c1;
  fVar6 = (this->worldMatrix).c2;
  fVar7 = (this->worldMatrix).c3;
  fVar8 = (this->worldMatrix).c4;
  fVar2 = (this->worldMatrix).d2;
  fVar3 = (this->worldMatrix).d3;
  fVar4 = (this->worldMatrix).d4;
  (paVar17->mOffsetMatrix).d1 = (this->worldMatrix).d1;
  (paVar17->mOffsetMatrix).d2 = fVar2;
  (paVar17->mOffsetMatrix).d3 = fVar3;
  (paVar17->mOffsetMatrix).d4 = fVar4;
  (paVar17->mOffsetMatrix).c1 = fVar5;
  (paVar17->mOffsetMatrix).c2 = fVar6;
  (paVar17->mOffsetMatrix).c3 = fVar7;
  (paVar17->mOffsetMatrix).c4 = fVar8;
  (paVar17->mOffsetMatrix).b1 = fVar9;
  (paVar17->mOffsetMatrix).b2 = fVar10;
  (paVar17->mOffsetMatrix).b3 = fVar11;
  (paVar17->mOffsetMatrix).b4 = fVar12;
  (paVar17->mOffsetMatrix).a1 = fVar13;
  (paVar17->mOffsetMatrix).a2 = fVar14;
  (paVar17->mOffsetMatrix).a3 = fVar15;
  (paVar17->mOffsetMatrix).a4 = fVar16;
  __src = (boneWeights->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
          .super__Vector_impl_data._M_start;
  paVar1 = (boneWeights->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__src != paVar1) {
    uVar18 = (long)paVar1 - (long)__src;
    paVar17->mNumWeights = (uint)((long)uVar18 >> 3);
    __s = (aiVertexWeight *)
          operator_new__(-(ulong)((ulong)((long)uVar18 >> 3) >> 0x3d != 0) | uVar18);
    memset(__s,0,(uVar18 - 8 & 0xfffffffffffffff8) + 8);
    paVar17->mWeights = __s;
    memcpy(__s,__src,uVar18);
  }
  return paVar17;
}

Assistant:

aiBone *Bone::ConvertToAssimpBone(Skeleton * /*parent*/, const std::vector<aiVertexWeight> &boneWeights)
{
    aiBone *bone = new aiBone();
    bone->mName = name;
    bone->mOffsetMatrix = worldMatrix;

    if (!boneWeights.empty())
    {
        bone->mNumWeights = static_cast<unsigned int>(boneWeights.size());
        bone->mWeights = new aiVertexWeight[boneWeights.size()];
        memcpy(bone->mWeights, &boneWeights[0], boneWeights.size() * sizeof(aiVertexWeight));
    }

    return bone;
}